

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl.h
# Opt level: O3

void a__GLTexureUpload1D(AGLTexture *tex,AGLTextureData *data,GLenum binding,A__GLTextureFormat tf)

{
  int iVar1;
  int iVar2;
  GLenum error;
  void *pvVar3;
  char *message;
  int iVar4;
  ulong uVar5;
  
  iVar1 = data->x;
  if (iVar1 < 1) {
    pvVar3 = data->pixels;
  }
  else {
    pvVar3 = (void *)0x0;
  }
  uVar5 = tf._0_8_ >> 0x20;
  iVar4 = data->width + iVar1;
  iVar2 = tex->width;
  if (binding != 0xde0) {
    aAppDebugPrintf("ERROR @ %s:%d: (%s) failed",
                    "/workspace/llm4binary/github/license_c_cmakelists/w23[P]atto/include/atto/gl.h"
                    ,0x3e4,"binding == GL_TEXTURE_1D");
    aAppTerminate(-1);
  }
  if (iVar2 < iVar4 || pvVar3 != (void *)0x0) {
    glTexImage1D(binding,0,tf._0_8_ & 0xffffffff,iVar4,0,uVar5,tf.type,pvVar3);
    error = glGetError();
    if (error != 0) {
      message = 
      "/workspace/llm4binary/github/license_c_cmakelists/w23[P]atto/include/atto/gl.h:1000: glTexImage1D(binding, 0, tf.internal, maxwidth, 0, tf.format, tf.type, to_upload) returned "
      ;
      goto LAB_001041c6;
    }
    tex->width = iVar4;
  }
  if (0 < iVar1) {
    pvVar3 = data->pixels;
    if (pvVar3 == (void *)0x0) {
      aAppDebugPrintf("ERROR @ %s:%d: (%s) failed",
                      "/workspace/llm4binary/github/license_c_cmakelists/w23[P]atto/include/atto/gl.h"
                      ,0x3ed,"data->pixels");
      aAppTerminate(-1);
      pvVar3 = data->pixels;
    }
    glTexSubImage1D(binding,0,data->x,data->width,uVar5,tf.type,pvVar3);
    error = glGetError();
    if (error != 0) {
      message = 
      "/workspace/llm4binary/github/license_c_cmakelists/w23[P]atto/include/atto/gl.h:1008: glTexSubImage1D(binding, 0, data->x, data->width, tf.format, tf.type, data->pixels) returned "
      ;
LAB_001041c6:
      a__GlPrintError(message,error);
      abort();
    }
  }
  return;
}

Assistant:

static void a__GLTexureUpload1D(AGLTexture *tex, const AGLTextureData *data, GLenum binding, struct A__GLTextureFormat tf) {
	const int maxwidth = data->x + data->width;

	const int expand = maxwidth > tex->width;
	const int is_subimage = data->x > 0;
	const void *const to_upload = (!is_subimage && data->pixels) ? data->pixels : NULL;

	ATTO_ASSERT(binding == GL_TEXTURE_1D);

	if (expand || to_upload) {
		AGL__CALL(glTexImage1D(binding, 0, tf.internal, maxwidth, 0,
			tf.format, tf.type, to_upload));
		tex->width = maxwidth;
	}

	if (is_subimage) {
		ATTO_ASSERT(data->pixels);
		AGL__CALL(glTexSubImage1D(binding, 0,
			data->x, data->width,
			tf.format, tf.type, data->pixels));
	}
}